

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcList * sqlite3SrcListEnlarge(sqlite3 *db,SrcList *pSrc,int nExtra,int iStart)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  SrcList *pSVar5;
  long lVar6;
  SrcList *pSVar7;
  long lVar8;
  undefined4 *puVar9;
  u64 n;
  long lVar10;
  ulong uVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  byte bVar14;
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar18 [16];
  
  bVar14 = 0;
  iVar16 = pSrc->nSrc;
  pSVar5 = pSrc;
  if (pSrc->nAlloc < (uint)(iVar16 + nExtra)) {
    n = (long)(nExtra + iVar16 * 2 + -1) * 0x70 + 0x78;
    pSVar7 = (SrcList *)(db->lookaside).pStart;
    if (((pSrc < pSVar7) || ((SrcList *)(db->lookaside).pEnd <= pSrc)) || ((db->lookaside).sz < n))
    {
      pSVar5 = (SrcList *)dbReallocFinish(db,pSrc,n);
      if (pSVar5 == (SrcList *)0x0) {
        return pSrc;
      }
      pSVar7 = (SrcList *)(db->lookaside).pStart;
    }
    if ((pSVar5 < pSVar7) || ((SrcList *)(db->lookaside).pEnd <= pSVar5)) {
      uVar4 = (*sqlite3Config.m.xSize)(pSVar5);
    }
    else {
      uVar4 = (uint)(db->lookaside).sz;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)uVar4 - 0x78U >> 4;
    pSVar5->nAlloc = SUB164(auVar1 * ZEXT816(0x2492492492492493),8) + 1;
    iVar16 = pSVar5->nSrc;
  }
  if (iStart < iVar16) {
    lVar6 = (long)iVar16;
    lVar10 = lVar6 * 0x70 + -0x68;
    do {
      lVar6 = lVar6 + -1;
      puVar12 = (undefined8 *)((long)pSVar5->a + lVar10 + -8);
      puVar13 = (undefined8 *)((long)pSVar5->a + lVar10 + (long)nExtra * 0x70 + -8);
      for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar13 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
        puVar13 = puVar13 + (ulong)bVar14 * -2 + 1;
      }
      lVar10 = lVar10 + -0x70;
    } while (iStart < lVar6);
    iVar16 = pSVar5->nSrc;
  }
  lVar6 = (long)iStart;
  pSVar5->nSrc = iVar16 + nExtra;
  memset(pSVar5->a + lVar6,0,(ulong)(uint)nExtra * 0x70);
  auVar3 = _DAT_00264660;
  auVar2 = _DAT_00264650;
  auVar1 = _DAT_00264640;
  if (0 < nExtra) {
    lVar10 = (long)(iStart + nExtra);
    if ((long)(iStart + nExtra) < lVar6 + 1) {
      lVar10 = lVar6 + 1;
    }
    lVar8 = (lVar10 - lVar6) + -1;
    auVar15._8_4_ = (int)lVar8;
    auVar15._0_8_ = lVar8;
    auVar15._12_4_ = (int)((ulong)lVar8 >> 0x20);
    puVar9 = (undefined4 *)((long)&pSVar5[3].a[lVar6].pSelect + 4);
    uVar11 = 0;
    auVar15 = auVar15 ^ _DAT_00264660;
    do {
      auVar17._8_4_ = (int)uVar11;
      auVar17._0_8_ = uVar11;
      auVar17._12_4_ = (int)(uVar11 >> 0x20);
      auVar18 = (auVar17 | auVar2) ^ auVar3;
      iVar16 = auVar15._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar16 && auVar15._0_4_ < auVar18._0_4_ ||
                  iVar16 < auVar18._4_4_) & 1)) {
        puVar9[-0x54] = 0xffffffff;
      }
      if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
          auVar18._12_4_ <= auVar15._12_4_) {
        puVar9[-0x38] = 0xffffffff;
      }
      auVar17 = (auVar17 | auVar1) ^ auVar3;
      iVar19 = auVar17._4_4_;
      if (iVar19 <= iVar16 && (iVar19 != iVar16 || auVar17._0_4_ <= auVar15._0_4_)) {
        puVar9[-0x1c] = 0xffffffff;
        *puVar9 = 0xffffffff;
      }
      uVar11 = uVar11 + 4;
      puVar9 = puVar9 + 0x70;
    } while (((lVar10 - lVar6) + 3U & 0xfffffffffffffffc) != uVar11);
  }
  return pSVar5;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  sqlite3 *db,       /* Database connection to notify of OOM errors */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( (u32)pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    int nAlloc = pSrc->nSrc*2+nExtra;
    int nGot;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return pSrc;
    }
    pSrc = pNew;
    nGot = (sqlite3DbMallocSize(db, pNew) - sizeof(*pSrc))/sizeof(pSrc->a[0])+1;
    pSrc->nAlloc = nGot;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}